

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::on_piece_verified
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  pointer pdVar1;
  tribool x;
  bool bVar2;
  bool bVar3;
  int iVar4;
  tribool tVar5;
  uint uVar6;
  undefined4 extraout_var;
  storage_error *psVar7;
  tribool tVar8;
  tribool y;
  tribool x_00;
  char *pcVar9;
  value_t vVar10;
  bool bVar11;
  string_view job_name;
  span<const_libtorrent::digest32<256L>_> block_hashes_00;
  value_t local_9c;
  digest32<160L> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  sha1_hash local_44;
  
  if ((((this->super_torrent_hot_members).field_0x4b & 4) == 0) && ((this->field_0x5e0 & 4) == 0)) {
    piece_picker::completed_hash_job
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece);
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    bVar2 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar4),0x8016);
    vVar10 = true_value;
    tVar5.value = vVar10;
    local_9c = vVar10;
    if (!bVar2) {
      local_9c = false_value;
      tVar5.value = false_value;
      if ((error->ec).val_ == 0) {
        psVar7 = error;
        bVar2 = info_hash_t::has_v1(&((this->super_torrent_hot_members).m_torrent_file.
                                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->m_info_hash);
        local_9c = indeterminate_value;
        if (bVar2) {
          local_88.m_number._M_elems[4] = (piece_hash->m_number)._M_elems[4];
          local_88.m_number._M_elems._0_8_ = *(undefined8 *)(piece_hash->m_number)._M_elems;
          local_88.m_number._M_elems._8_8_ = *(undefined8 *)((piece_hash->m_number)._M_elems + 2);
          torrent_info::hash_for_piece
                    (&local_44,
                     (this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,piece);
          bVar2 = digest32<160L>::operator==(&local_88,&local_44);
          local_9c = (value_t)bVar2;
        }
        pdVar1 = (block_hashes->
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ).
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar5.value = indeterminate_value;
        if (pdVar1 != (block_hashes->
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      ).
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          block_hashes_00.m_len = (difference_type)psVar7;
          block_hashes_00.m_ptr = pdVar1;
          tVar5 = on_blocks_hashed(this,piece,block_hashes_00);
        }
      }
    }
    x_00.value = (uint)(local_9c != true_value) * 2;
    if (local_9c == false_value) {
      x_00.value = vVar10;
    }
    tVar8.value = indeterminate_value - (local_9c == false_value && tVar5.value == true_value);
    if (tVar5.value == false_value) {
      tVar8.value = false_value;
    }
    y.value = (uint)(tVar5.value != true_value) * 2;
    if (tVar5.value == false_value) {
      y.value = vVar10;
    }
    x.value = indeterminate_value - (tVar5.value == false_value && local_9c == true_value);
    if (tVar5.value == true_value) {
      x.value = false_value;
    }
    if (local_9c == false_value) {
      x.value = false_value;
    }
    iVar4 = (error->ec).val_;
    if (local_9c == true_value) {
      tVar8.value = false_value;
    }
    tVar8 = boost::logic::operator||(x,tVar8);
    if ((iVar4 == 0) && (tVar8.value == true_value)) {
      handle_inconsistent_hashes(this,piece);
    }
    else {
      tVar8 = boost::logic::operator||(x_00,y);
      bVar2 = tVar8.value == true_value;
      bVar11 = (error->ec).val_ != 0;
      if (bVar11 && bVar2) {
        job_name._M_str = "piece_verified";
        job_name._M_len = 0xe;
        handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
      }
      iVar4 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar4 != '\0') {
        tVar8 = boost::logic::operator||(local_9c,tVar5);
        pcVar9 = "disk failed";
        if (tVar8.value == true_value) {
          pcVar9 = "passed";
        }
        if (tVar8.value != true_value && (!bVar11 || !bVar2)) {
          tVar8 = boost::logic::operator||(x_00,y);
          pcVar9 = "-";
          if (tVar8.value == true_value) {
            pcVar9 = "failed";
          }
        }
        uVar6 = file_storage::piece_size
                          (&((this->super_torrent_hot_members).m_torrent_file.
                             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_files,piece);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** PIECE_FINISHED [ p: %d | chk: %s | size: %d ]",(ulong)(uint)piece.m_val
                   ,pcVar9,(ulong)uVar6);
      }
      if (((this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
           (piece_picker *)0x0) || (((this->super_torrent_hot_members).field_0x4b & 0x40) == 0)) {
        need_picker(this);
        state_updated(this);
        bVar3 = piece_picker::is_piece_finished
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,piece);
        if (bVar3) {
          if (bVar11 && bVar2) {
            update_gauge(this);
          }
          else {
            tVar5 = boost::logic::operator||(local_9c,tVar5);
            if (tVar5.value == true_value) {
              piece_passed(this,piece);
              if ((this->field_0x5cc & 4) != 0) {
                verified(this,piece);
              }
            }
            else {
              tVar5 = boost::logic::operator||(x_00,y);
              if (tVar5.value == true_value) {
                local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                piece_failed(this,piece,(vector<int,_std::allocator<int>_> *)&local_68);
                ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_piece_verified(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece
		, sha1_hash const& piece_hash, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;
		if (m_deleted) return;

		m_picker->completed_hash_job(piece);

		boost::tribool passed = boost::indeterminate;
		boost::tribool v2_passed = boost::indeterminate;

		if (settings().get_bool(settings_pack::disable_hash_checks))
		{
			passed = v2_passed = true;
		}
		else if (error)
		{
			passed = v2_passed = false;
		}
		else
		{
			if (torrent_file().info_hashes().has_v1())
			{
				passed = sha1_hash(piece_hash) == m_torrent_file->hash_for_piece(piece);
			}

			if (!block_hashes.empty())
			{
				TORRENT_ASSERT(torrent_file().info_hashes().has_v2());
				v2_passed = on_blocks_hashed(piece, block_hashes);
			}
		}

		if (!error && ((passed && !v2_passed) || (!passed && v2_passed)))
		{
			handle_inconsistent_hashes(piece);
			return;
		}

		bool const disk_error = (!passed || !v2_passed) && error;

		if (disk_error) handle_disk_error("piece_verified", error);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** PIECE_FINISHED [ p: %d | chk: %s | size: %d ]"
				, static_cast<int>(piece)
				, (passed || v2_passed) ? "passed"
				: disk_error ? "disk failed"
				: (!passed || !v2_passed) ? "failed"
				: "-"
				, m_torrent_file->piece_size(piece));
		}
#endif
		TORRENT_ASSERT(valid_metadata());

		// if we're a seed we don't have a picker
		// and we also don't have to do anything because
		// we already have this piece
		if (!has_picker() && m_have_all) return;

		need_picker();

		TORRENT_ASSERT(!m_picker->have_piece(piece));

		state_updated();

		// even though the piece passed the hash-check
		// it might still have failed being written to disk
		// if so, piece_picker::write_failed() has been
		// called, and the piece is no longer finished.
		// in this case, we have to ignore the fact that
		// it passed the check
		if (!m_picker->is_piece_finished(piece)) return;

		if (disk_error)
		{
			update_gauge();
		}
		else if (passed || v2_passed)
		{
			// the following call may cause picker to become invalid
			// in case we just became a seed
			piece_passed(piece);
			// if we're in seed mode, we just acquired this piece
			// mark it as verified
			if (m_seed_mode) verified(piece);
		}
		else if (!passed || !v2_passed)
		{
			// piece_failed() will restore the piece
			piece_failed(piece);
		}
	}
	catch (...) { handle_exception(); }